

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_a.h
# Opt level: O0

void post_reentrancy(tsd_t *tsd)

{
  char cVar1;
  undefined1 *in_RDI;
  int8_t *reentrancy_level;
  uint8_t state;
  undefined7 in_stack_ffffffffffffffe0;
  
  cVar1 = in_RDI[3] + -1;
  in_RDI[3] = cVar1;
  if (cVar1 == '\0') {
    tsd_slow_update((tsd_t *)CONCAT17(*in_RDI,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

static inline void
post_reentrancy(tsd_t *tsd) {
	int8_t *reentrancy_level = tsd_reentrancy_levelp_get(tsd);
	assert(*reentrancy_level > 0);
	if (--*reentrancy_level == 0) {
		tsd_slow_update(tsd);
	}
}